

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * common_token_to_piece_abi_cxx11_(llama_vocab *vocab,llama_token token,bool special)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  byte in_CL;
  undefined4 in_EDX;
  undefined8 in_RSI;
  string *in_RDI;
  int check;
  int n_chars;
  string *piece;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::capacity();
  std::__cxx11::string::resize((ulong)in_RDI);
  uVar4 = std::__cxx11::string::operator[]((ulong)in_RDI);
  uVar1 = std::__cxx11::string::size();
  iVar2 = llama_token_to_piece(in_RSI,in_EDX,uVar4,uVar1,0,in_CL & 1);
  if (iVar2 < 0) {
    std::__cxx11::string::resize((ulong)in_RDI);
    uVar4 = std::__cxx11::string::operator[]((ulong)in_RDI);
    uVar1 = std::__cxx11::string::size();
    iVar3 = llama_token_to_piece(in_RSI,in_EDX,uVar4,uVar1,0,in_CL & 1);
    if (iVar3 != -iVar2) {
      uVar4 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                         ,0x4fe,"GGML_ASSERT(%s) failed","check == -n_chars");
      std::__cxx11::string::~string((string *)in_RDI);
      _Unwind_Resume(uVar4);
    }
  }
  else {
    std::__cxx11::string::resize((ulong)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string common_token_to_piece(const struct llama_vocab * vocab, llama_token token, bool special) {
    std::string piece;
    piece.resize(piece.capacity());  // using string internal cache, 15 bytes + '\n'
    const int n_chars = llama_token_to_piece(vocab, token, &piece[0], piece.size(), 0, special);
    if (n_chars < 0) {
        piece.resize(-n_chars);
        int check = llama_token_to_piece(vocab, token, &piece[0], piece.size(), 0, special);
        GGML_ASSERT(check == -n_chars);
    }
    else {
        piece.resize(n_chars);
    }

    return piece;
}